

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

void Abc_NtkDarConstr(Abc_Ntk_t *pNtk,int nFrames,int nConfs,int nProps,int fStruct,int fOldAlgo,
                     int fVerbose)

{
  Aig_Man_t *p;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x1175,"void Abc_NtkDarConstr(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  p = Abc_NtkToDar(pNtk,0,1);
  if (p != (Aig_Man_t *)0x0) {
    if (fStruct == 0) {
      Saig_ManDetectConstrFuncTest(p,nFrames,nConfs,nProps,fOldAlgo,fVerbose);
    }
    else {
      Saig_ManDetectConstrTest(p);
    }
    Aig_ManStop(p);
    return;
  }
  return;
}

Assistant:

void Abc_NtkDarConstr( Abc_Ntk_t * pNtk, int nFrames, int nConfs, int nProps, int fStruct, int fOldAlgo, int fVerbose )
{
    Aig_Man_t * pMan;//, * pMan2;//, * pTemp;
    assert( Abc_NtkIsStrash(pNtk) );
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return;
    if ( fStruct )
        Saig_ManDetectConstrTest( pMan );
    else
        Saig_ManDetectConstrFuncTest( pMan, nFrames, nConfs, nProps, fOldAlgo, fVerbose );
    Aig_ManStop( pMan );
}